

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O1

nbt_list * filter_list(nbt_list *list,nbt_predicate_t predicate,void *aux)

{
  list_head *plVar1;
  list_head *plVar2;
  nbt_list *list_00;
  list_head *plVar3;
  nbt_node *pnVar4;
  int *piVar5;
  undefined8 *puVar6;
  int iVar7;
  
  if (list == (nbt_list *)0x0) {
    __assert_fail("list",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0xe7,
                  "struct nbt_list *filter_list(const struct nbt_list *, nbt_predicate_t, void *)");
  }
  list_00 = (nbt_list *)malloc(0x18);
  if (list_00 == (nbt_list *)0x0) {
    piVar5 = __errno_location();
    *piVar5 = -2;
LAB_0010308e:
    piVar5 = __errno_location();
    if (*piVar5 == 0) {
      *piVar5 = -2;
    }
    nbt_free_list(list_00);
    list_00 = (nbt_list *)0x0;
  }
  else {
    list_00->data = (nbt_node *)0x0;
    plVar3 = &list_00->entry;
    (list_00->entry).blink = plVar3;
    (list_00->entry).flink = plVar3;
    for (plVar1 = (list->entry).flink; plVar1 != &list->entry; plVar1 = plVar1->flink) {
      pnVar4 = nbt_filter((nbt_node *)plVar1[-1].flink,predicate,aux);
      piVar5 = __errno_location();
      iVar7 = 4;
      if (*piVar5 == 0) {
        if (pnVar4 == (nbt_node *)0x0) {
          iVar7 = 7;
        }
        else {
          puVar6 = (undefined8 *)malloc(0x18);
          if (puVar6 == (undefined8 *)0x0) {
            *piVar5 = -2;
          }
          else {
            *puVar6 = pnVar4;
            puVar6[2] = plVar3;
            plVar2 = plVar3->blink;
            puVar6[1] = plVar2;
            plVar3->blink = (list_head *)(puVar6 + 1);
            plVar2->flink = (list_head *)(puVar6 + 1);
            iVar7 = 0;
          }
        }
      }
      if ((iVar7 != 0) && (iVar7 != 7)) {
        if (iVar7 != 4) {
          return list_00;
        }
        goto LAB_0010308e;
      }
    }
  }
  return list_00;
}

Assistant:

static struct nbt_list* filter_list(const struct nbt_list* list, nbt_predicate_t predicate, void* aux)
{
    assert(list);

    struct nbt_list* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, goto filter_error);

    ret->data = NULL;
    INIT_LIST_HEAD(&ret->entry);

    const struct list_head* pos;
    list_for_each(pos, &list->entry)
    {
        const struct nbt_list* p = list_entry(pos, struct nbt_list, entry);

        nbt_node* new_node = nbt_filter(p->data, predicate, aux);

        if(errno != NBT_OK)  goto filter_error;
        if(new_node == NULL) continue;

        struct nbt_list* new_entry;
        CHECKED_MALLOC(new_entry, sizeof *new_entry, goto filter_error);

        new_entry->data = new_node;
        list_add_tail(&new_entry->entry, &ret->entry);
    }

    return ret;

filter_error:
    if(errno == NBT_OK)
        errno = NBT_EMEM;

    nbt_free_list(ret);
    return NULL;
}